

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O2

bool (anonymous_namespace)::qt_starts_with_impl<QStringView,QLatin1StringView>
               (QStringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  QStringView lhs;
  
  pcVar3 = (char *)needle.m_size;
  lhs.m_data = haystack.m_data;
  pcVar1 = needle.m_data;
  if ((lhs.m_data != (storage_type_conflict *)0x0) && (pcVar1 = pcVar3, haystack.m_size != 0)) {
    if ((long)pcVar3 <= haystack.m_size) {
      lhs.m_size = (qsizetype)pcVar3;
      iVar2 = QtPrivate::compareStrings(lhs,needle,cs);
      return iVar2 == 0;
    }
    return false;
  }
  return pcVar1 == (char *)0x0;
}

Assistant:

[[nodiscard]] constexpr bool isNull() const noexcept { return !m_data; }